

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void direct_partition_merging
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,MB_MODE_INFO **mib,
               int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  byte bVar1;
  uint8_t ref_frame_type;
  TX_SIZE TVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  MB_MODE_INFO_EXT *mbmi_ext_00;
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  uint in_R8D;
  int in_R9D;
  BLOCK_SIZE in_stack_00000008;
  int x_idx;
  int y;
  TX_SIZE tx_size;
  int num_planes;
  BLOCK_SIZE this_subsize;
  MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame;
  MB_MODE_INFO_EXT *mbmi_ext;
  YV12_BUFFER_CONFIG *cfg;
  int num_planes_1;
  int is_uv_subpel_mv;
  int is_y_subpel_mv;
  int is_scaled;
  scale_factors *sf;
  int continue_merging;
  int j;
  int i;
  _Bool use_scaled_ref;
  int skip_pred_mv;
  int force_skip_low_temp_var;
  buf_2d yv12_mb [8] [3];
  int_mv frame_mv [25] [8];
  MV_REFERENCE_FRAME ref_frame;
  PARTITION_TYPE orig_partition;
  BLOCK_SIZE orig_bsize;
  MB_MODE_INFO **this_mi;
  int different_seg;
  int diffent_filter;
  int unsupported_motion_mode;
  int different_mv;
  int unsupported_mode;
  int different_mode;
  int different_ref;
  int compound;
  int no_skip;
  int further_split;
  MB_MODE_INFO **b3;
  MB_MODE_INFO **b2;
  MB_MODE_INFO **b1;
  MB_MODE_INFO **b0;
  BLOCK_SIZE subsize;
  PARTITION_TYPE partition;
  int hbs;
  int bs;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  TileInfo *tile_info;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  undefined4 in_stack_fffffffffffff87c;
  undefined1 in_stack_fffffffffffff884;
  PARTITION_TYPE in_stack_fffffffffffff885;
  BLOCK_SIZE in_stack_fffffffffffff886;
  undefined1 in_stack_fffffffffffff887;
  undefined1 *puVar6;
  int in_stack_fffffffffffff890;
  undefined1 in_stack_fffffffffffff894;
  PARTITION_TYPE in_stack_fffffffffffff895;
  BLOCK_SIZE in_stack_fffffffffffff896;
  BLOCK_SIZE in_stack_fffffffffffff897;
  int in_stack_fffffffffffff898;
  int in_stack_fffffffffffff89c;
  undefined4 in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a4;
  undefined8 in_stack_fffffffffffff8a8;
  MB_MODE_INFO_EXT_FRAME *mbmi_ext_best;
  MACROBLOCK *in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b8;
  uint uVar7;
  undefined1 in_stack_fffffffffffff8bc;
  undefined1 uVar8;
  undefined1 in_stack_fffffffffffff8bd;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  uint mi_col_00;
  int in_stack_fffffffffffff8cc;
  undefined4 in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d4;
  int in_stack_fffffffffffff8dc;
  MACROBLOCKD *in_stack_fffffffffffff8e0;
  int in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff904;
  BLOCK_SIZE BVar19;
  buf_2d (*in_stack_fffffffffffff908) [3];
  undefined4 in_stack_fffffffffffff910;
  int iVar20;
  int in_stack_fffffffffffff914;
  int local_6e8;
  MV_REFERENCE_FRAME in_stack_fffffffffffff91f;
  undefined4 uVar21;
  undefined4 uVar22;
  AV1_COMP *in_stack_fffffffffffff928;
  int in_stack_fffffffffffff940;
  int in_stack_fffffffffffff948;
  _Bool *in_stack_fffffffffffff950;
  undefined4 local_3d8 [104];
  short asStack_238 [194];
  char local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  long *local_b0;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  long *local_80;
  long *local_78;
  long *local_70;
  long *local_68;
  BLOCK_SIZE local_5a;
  undefined1 local_59;
  uint local_58;
  uint local_54;
  long local_50;
  long local_48;
  long local_40;
  long *local_38;
  AV1_COMMON *local_30;
  int local_28;
  uint local_24;
  long *local_20;
  long *local_8;
  
  BVar19 = (BLOCK_SIZE)((uint)in_stack_fffffffffffff904 >> 0x18);
  local_30 = (AV1_COMMON *)(in_RDI + 0x77f0);
  local_38 = in_RDI + 0x7831;
  local_50 = in_RSI + 0x1a0;
  local_54 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [in_stack_00000008];
  local_58 = local_54 / 2;
  local_48 = in_RSI;
  local_40 = in_RDX;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_8 = in_RDI;
  if (in_stack_00000008 < BLOCK_8X8) {
    mi_col_00 = 0;
  }
  else {
    bVar1 = get_partition(local_30,in_R8D,in_R9D,in_stack_00000008);
    mi_col_00 = (uint)bVar1;
  }
  local_59 = (undefined1)mi_col_00;
  local_5a = get_partition_subsize(in_stack_fffffffffffff886,in_stack_fffffffffffff885);
  local_68 = local_20;
  local_70 = local_20 + (int)local_58;
  local_78 = local_20 + (int)(local_58 * *(int *)((long)local_38 + 0x3c));
  local_80 = local_20 +
             (long)(int)(local_58 * *(int *)((long)local_38 + 0x3c)) + (long)(int)local_58;
  uVar18 = true;
  if (((local_5a <= *(BLOCK_SIZE *)*local_20) &&
      (uVar18 = true, local_5a <= *(BLOCK_SIZE *)*local_70)) &&
     (uVar18 = true, local_5a <= *(BLOCK_SIZE *)*local_78)) {
    uVar18 = *(BLOCK_SIZE *)*local_80 < local_5a;
  }
  local_84 = (uint)(byte)uVar18;
  if (local_84 == 0) {
    bVar1 = 1;
    if (((*(char *)(*local_20 + 0x90) != '\0') && (bVar1 = 1, *(char *)(*local_70 + 0x90) != '\0'))
       && (bVar1 = 1, *(char *)(*local_78 + 0x90) != '\0')) {
      bVar1 = *(char *)(*local_80 + 0x90) != '\0' ^ 0xff;
    }
    local_88 = (uint)(bVar1 & 1);
    if (local_88 == 0) {
      uVar17 = true;
      if (((*(char *)(*local_20 + 0x11) == *(char *)(*local_70 + 0x11)) &&
          (uVar17 = true, *(char *)(*local_20 + 0x11) == *(char *)(*local_78 + 0x11))) &&
         (uVar17 = true, *(char *)(*local_20 + 0x11) == *(char *)(*local_80 + 0x11))) {
        uVar17 = (uint)(int)*(char *)(*local_20 + 0x11) < 0x80000000;
      }
      local_8c = (uint)(byte)uVar17;
      if (local_8c == 0) {
        uVar16 = true;
        if (((*(char *)(*local_20 + 0x10) == *(char *)(*local_70 + 0x10)) &&
            (uVar16 = true, *(char *)(*local_20 + 0x10) == *(char *)(*local_78 + 0x10))) &&
           (uVar16 = true, *(char *)(*local_20 + 0x10) == *(char *)(*local_80 + 0x10))) {
          uVar16 = *(char *)(*local_20 + 0x10) < '\x01';
        }
        local_90 = (uint)(byte)uVar16;
        if (local_90 == 0) {
          uVar15 = true;
          if ((*(char *)(*local_20 + 2) == *(char *)(*local_70 + 2)) &&
             (uVar15 = true, *(char *)(*local_20 + 2) == *(char *)(*local_78 + 2))) {
            uVar15 = *(char *)(*local_20 + 2) != *(char *)(*local_80 + 2);
          }
          local_94 = (uint)(byte)uVar15;
          if (local_94 == 0) {
            uVar14 = false;
            if (*(char *)(*local_20 + 2) != '\r') {
              uVar14 = *(char *)(*local_20 + 2) != '\x0f';
            }
            local_98 = (uint)(byte)uVar14;
            if (local_98 == 0) {
              uVar13 = true;
              if ((*(int *)(*local_20 + 8) == *(int *)(*local_70 + 8)) &&
                 (uVar13 = true, *(int *)(*local_20 + 8) == *(int *)(*local_78 + 8))) {
                uVar13 = *(int *)(*local_20 + 8) != *(int *)(*local_80 + 8);
              }
              local_9c = (uint)(byte)uVar13;
              if (local_9c == 0) {
                uVar12 = true;
                if (((*(char *)(*local_20 + 0x18) == *(char *)(*local_70 + 0x18)) &&
                    (uVar12 = true, *(char *)(*local_20 + 0x18) == *(char *)(*local_78 + 0x18))) &&
                   (uVar12 = true, *(char *)(*local_20 + 0x18) == *(char *)(*local_80 + 0x18))) {
                  uVar12 = *(char *)(*local_20 + 0x18) != '\0';
                }
                local_a0 = (uint)(byte)uVar12;
                if (local_a0 == 0) {
                  uVar11 = true;
                  if ((*(int *)(*local_20 + 0x14) == *(int *)(*local_70 + 0x14)) &&
                     (uVar11 = true, *(int *)(*local_20 + 0x14) == *(int *)(*local_78 + 0x14))) {
                    uVar11 = *(int *)(*local_20 + 0x14) != *(int *)(*local_80 + 0x14);
                  }
                  local_a4 = (uint)(byte)uVar11;
                  if (local_a4 == 0) {
                    uVar10 = true;
                    if ((((byte)*(undefined2 *)(*local_20 + 0xa7) & 7) ==
                         ((byte)*(undefined2 *)(*local_70 + 0xa7) & 7)) &&
                       (uVar10 = true,
                       ((byte)*(undefined2 *)(*local_20 + 0xa7) & 7) ==
                       ((byte)*(undefined2 *)(*local_78 + 0xa7) & 7))) {
                      uVar10 = ((byte)*(undefined2 *)(*local_20 + 0xa7) & 7) !=
                               ((byte)*(undefined2 *)(*local_80 + 0xa7) & 7);
                    }
                    local_a8 = (uint)(byte)uVar10;
                    if (local_a8 == 0) {
                      local_b0 = local_20;
                      local_b1 = *(undefined1 *)*local_20;
                      local_b2 = *(undefined1 *)(*local_20 + 1);
                      *(BLOCK_SIZE *)*local_20 = in_stack_00000008;
                      *(undefined1 *)(*local_20 + 1) = 0;
                      *(undefined1 *)(*local_20 + 0x90) = 1;
                      av1_set_offsets_without_segment_id
                                ((AV1_COMP *)
                                 CONCAT17(uVar18,CONCAT16(bVar1,CONCAT15(uVar17,CONCAT14(uVar16,
                                                  CONCAT13(uVar15,CONCAT12(uVar14,CONCAT11(uVar13,
                                                  uVar12))))))),
                                 (TileInfo *)
                                 CONCAT17(uVar11,CONCAT16(uVar10,CONCAT15(in_stack_fffffffffffff8bd,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8)))),
                                 in_stack_fffffffffffff8b0,
                                 (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                                 (int)in_stack_fffffffffffff8a8,
                                 (BLOCK_SIZE)((uint)in_stack_fffffffffffff8a4 >> 0x18));
                      local_b3 = *(char *)(*local_b0 + 0x10);
                      uVar21 = 0;
                      for (local_6e8 = 0; local_6e8 < 0x19; local_6e8 = local_6e8 + 1) {
                        for (in_stack_fffffffffffff914 = 0; in_stack_fffffffffffff914 < 8;
                            in_stack_fffffffffffff914 = in_stack_fffffffffffff914 + 1) {
                          local_3d8[(long)local_6e8 * 8 + (long)in_stack_fffffffffffff914] =
                               0x80008000;
                        }
                      }
                      *(undefined2 *)(local_48 + 0x25626) = *(undefined2 *)(local_48 + 0x25620);
                      uVar9 = false;
                      if ((2 < *(int *)(local_48 + 0x17200)) &&
                         (uVar9 = false, *(char *)(local_48 + 0x25626) != '\x02')) {
                        uVar9 = *(char *)(local_48 + 0x25627) != '\x02';
                      }
                      uVar5 = (uint)(byte)uVar9;
                      puVar6 = &stack0xfffffffffffff91f;
                      uVar4 = uVar5;
                      uVar22 = uVar21;
                      find_predictors(in_stack_fffffffffffff928,(MACROBLOCK *)(ulong)uVar5,
                                      in_stack_fffffffffffff91f,
                                      (int_mv (*) [8])
                                      CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                                      in_stack_fffffffffffff908,BVar19,in_stack_fffffffffffff940,
                                      in_stack_fffffffffffff948,in_stack_fffffffffffff950);
                      iVar20 = 1;
                      if ((asStack_238[(long)local_b3 * 2] != *(short *)(*local_68 + 8)) ||
                         (asStack_238[(long)local_b3 * 2 + 1] != *(short *)(*local_68 + 10))) {
                        iVar20 = 0;
                      }
                      if (iVar20 == 0) {
                        *(undefined1 *)*local_b0 = local_b1;
                        *(undefined1 *)(*local_b0 + 1) = local_b2;
                        av1_set_offsets_without_segment_id
                                  ((AV1_COMP *)
                                   CONCAT17(uVar18,CONCAT16(bVar1,CONCAT15(uVar17,CONCAT14(uVar16,
                                                  CONCAT13(uVar15,CONCAT12(uVar14,CONCAT11(uVar13,
                                                  uVar12))))))),
                                   (TileInfo *)
                                   CONCAT17(uVar11,CONCAT16(uVar10,CONCAT15(uVar9,CONCAT14(
                                                  in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8)))),
                                   in_stack_fffffffffffff8b0,
                                   (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                                   (int)in_stack_fffffffffffff8a8,
                                   (BLOCK_SIZE)((uint)in_stack_fffffffffffff8a4 >> 0x18));
                        find_predictors(in_stack_fffffffffffff928,
                                        (MACROBLOCK *)CONCAT44(uVar22,uVar4),
                                        in_stack_fffffffffffff91f,
                                        (int_mv (*) [8])CONCAT44(in_stack_fffffffffffff914,iVar20),
                                        in_stack_fffffffffffff908,BVar19,in_stack_fffffffffffff940,
                                        in_stack_fffffffffffff948,in_stack_fffffffffffff950);
                      }
                      else {
                        get_ref_scale_factors
                                  ((AV1_COMMON *)
                                   CONCAT17(in_stack_fffffffffffff887,
                                            CONCAT16(in_stack_fffffffffffff886,
                                                     CONCAT15(in_stack_fffffffffffff885,
                                                              CONCAT14(in_stack_fffffffffffff884,
                                                                       uVar5)))),
                                   (MV_REFERENCE_FRAME)((uint)in_stack_fffffffffffff87c >> 0x18));
                        BVar19 = (BLOCK_SIZE)((ulong)in_stack_fffffffffffff8b0 >> 0x38);
                        iVar3 = av1_is_scaled((scale_factors *)
                                              CONCAT17(in_stack_fffffffffffff887,
                                                       CONCAT16(in_stack_fffffffffffff886,
                                                                CONCAT15(in_stack_fffffffffffff885,
                                                                         CONCAT14(
                                                  in_stack_fffffffffffff884,uVar5)))));
                        iVar20 = (int)*(short *)(*local_b0 + 8);
                        if (iVar20 < 1) {
                          iVar20 = -iVar20;
                        }
                        uVar8 = true;
                        if (iVar20 % 8 == 0) {
                          iVar20 = (int)*(short *)(*local_b0 + 10);
                          if (iVar20 < 1) {
                            iVar20 = -iVar20;
                          }
                          uVar8 = iVar20 % 8 != 0;
                        }
                        uVar4 = (uint)(byte)uVar8;
                        iVar20 = (int)*(short *)(*local_b0 + 8);
                        if (iVar20 < 1) {
                          iVar20 = -iVar20;
                        }
                        uVar7 = CONCAT13(1,(int3)in_stack_fffffffffffff8b8);
                        if (iVar20 % 0x10 == 0) {
                          iVar20 = (int)*(short *)(*local_b0 + 10);
                          if (iVar20 < 1) {
                            iVar20 = -iVar20;
                          }
                          uVar7 = CONCAT13(iVar20 % 0x10 != 0,(int3)in_stack_fffffffffffff8b8);
                        }
                        if ((((*(int *)(*local_8 + 0xc750) != 0) || (iVar3 != 0)) || (uVar4 != 0))
                           || (uVar7 >> 0x18 != 0)) {
                          iVar20 = av1_num_planes(local_30);
                          set_ref_ptrs((AV1_COMMON *)
                                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                       ,(MACROBLOCKD *)
                                        CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898
                                                ),in_stack_fffffffffffff897,
                                       in_stack_fffffffffffff896);
                          get_ref_frame_yv12_buf
                                    ((AV1_COMMON *)
                                     CONCAT17(in_stack_fffffffffffff897,
                                              CONCAT16(in_stack_fffffffffffff896,
                                                       CONCAT15(in_stack_fffffffffffff895,
                                                                CONCAT14(in_stack_fffffffffffff894,
                                                                         in_stack_fffffffffffff890))
                                                      )),(MV_REFERENCE_FRAME)((ulong)puVar6 >> 0x38)
                                    );
                          av1_setup_pre_planes
                                    (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8dc,
                                     (YV12_BUFFER_CONFIG *)
                                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                                     in_stack_fffffffffffff8cc,mi_col_00,
                                     (scale_factors *)
                                     CONCAT17(uVar18,CONCAT16(bVar1,CONCAT15(uVar17,CONCAT14(uVar16,
                                                  CONCAT13(uVar15,CONCAT12(uVar14,CONCAT11(uVar13,
                                                  uVar12))))))),uVar4);
                          if (((*(int *)(*local_8 + 0xc750) == 0) && (iVar3 == 0)) && (uVar4 == 0))
                          {
                            uVar5 = iVar20 - 1;
                            uVar21 = 1;
                            av1_enc_build_inter_predictor
                                      ((AV1_COMMON *)
                                       CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
                                       ,(MACROBLOCKD *)CONCAT44(in_stack_fffffffffffff8cc,mi_col_00)
                                       ,CONCAT13(uVar18,CONCAT12(bVar1,CONCAT11(uVar17,uVar16))),
                                       CONCAT13(uVar15,CONCAT12(uVar14,CONCAT11(uVar13,uVar12))),
                                       (BUFFER_SET *)
                                       CONCAT17(uVar11,CONCAT16(uVar10,CONCAT15(uVar9,CONCAT14(uVar8
                                                  ,uVar7)))),BVar19,(int)in_stack_fffffffffffff8e0,
                                       in_stack_fffffffffffff8e8);
                          }
                          else {
                            uVar5 = iVar20 - 1;
                            uVar21 = 0;
                            av1_enc_build_inter_predictor
                                      ((AV1_COMMON *)
                                       CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
                                       ,(MACROBLOCKD *)CONCAT44(in_stack_fffffffffffff8cc,mi_col_00)
                                       ,CONCAT13(uVar18,CONCAT12(bVar1,CONCAT11(uVar17,uVar16))),
                                       CONCAT13(uVar15,CONCAT12(uVar14,CONCAT11(uVar13,uVar12))),
                                       (BUFFER_SET *)
                                       CONCAT17(uVar11,CONCAT16(uVar10,CONCAT15(uVar9,CONCAT14(uVar8
                                                  ,uVar7)))),BVar19,(int)in_stack_fffffffffffff8e0,
                                       in_stack_fffffffffffff8e8);
                          }
                        }
                        mbmi_ext_00 = (MB_MODE_INFO_EXT *)(local_48 + 0x3c70);
                        mbmi_ext_best = *(MB_MODE_INFO_EXT_FRAME **)(local_48 + 0x4178);
                        ref_frame_type =
                             av1_ref_frame_type((MV_REFERENCE_FRAME *)
                                                CONCAT44(in_stack_fffffffffffff87c,uVar21));
                        av1_copy_mbmi_ext_to_mbmi_ext_frame
                                  (mbmi_ext_best,mbmi_ext_00,ref_frame_type);
                        get_partition_subsize(in_stack_fffffffffffff886,in_stack_fffffffffffff885);
                        update_ext_partition_context
                                  ((MACROBLOCKD *)
                                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                   in_stack_fffffffffffff89c,in_stack_fffffffffffff898,
                                   in_stack_fffffffffffff897,in_stack_fffffffffffff896,
                                   in_stack_fffffffffffff895);
                        BVar19 = (BLOCK_SIZE)((uint)in_stack_fffffffffffff89c >> 0x18);
                        av1_num_planes(local_30);
                        av1_reset_entropy_context
                                  ((MACROBLOCKD *)
                                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                   BVar19,in_stack_fffffffffffff898);
                        TVar2 = tx_size_from_tx_mode
                                          (in_stack_00000008,*(TX_MODE *)(local_48 + 0x24df0));
                        if (*(int *)(local_50 + 0x29c4 +
                                    (ulong)((byte)*(undefined2 *)(*local_b0 + 0xa7) & 7) * 4) != 0)
                        {
                          TVar2 = '\0';
                        }
                        *(TX_SIZE *)(*local_b0 + 0x91) = TVar2;
                        memset((void *)(*local_b0 + 0x92),(uint)*(byte *)(*local_b0 + 0x91),0x10);
                        *(TXFM_CONTEXT **)(local_50 + 0x1fc0) =
                             (local_30->above_contexts).txfm[*(int *)(local_40 + 0x10)] + local_28;
                        *(long *)(local_50 + 0x1fc8) =
                             local_50 + 0x1fd0 + (long)(int)(local_24 & 0x1f);
                        if (*(char *)(*local_b0 + 0x90) != '\0') {
                          is_inter_block((MB_MODE_INFO *)
                                         CONCAT17(in_stack_fffffffffffff887,
                                                  CONCAT16(in_stack_fffffffffffff886,
                                                           CONCAT15(in_stack_fffffffffffff885,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffff884,uVar5)))));
                        }
                        set_txfm_ctxs(in_stack_fffffffffffff897,in_stack_fffffffffffff890,
                                      (int)((ulong)puVar6 >> 0x20),(int)puVar6,
                                      (MACROBLOCKD *)
                                      CONCAT17(in_stack_fffffffffffff887,
                                               CONCAT16(in_stack_fffffffffffff886,
                                                        CONCAT15(in_stack_fffffffffffff885,
                                                                 CONCAT14(in_stack_fffffffffffff884,
                                                                          uVar5)))));
                        for (iVar20 = 0; iVar20 < (int)local_54; iVar20 = iVar20 + 1) {
                          for (iVar3 = 0; iVar3 < (int)local_54; iVar3 = iVar3 + 1) {
                            local_b0[iVar3 + iVar20 * *(int *)((long)local_38 + 0x3c)] = *local_b0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void direct_partition_merging(AV1_COMP *cpi, ThreadData *td,
                                     TileDataEnc *tile_data, MB_MODE_INFO **mib,
                                     int mi_row, int mi_col, BLOCK_SIZE bsize) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  const PARTITION_TYPE partition =
      (bsize >= BLOCK_8X8) ? get_partition(cm, mi_row, mi_col, bsize)
                           : PARTITION_NONE;
  BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);

  MB_MODE_INFO **b0 = mib;
  MB_MODE_INFO **b1 = mib + hbs;
  MB_MODE_INFO **b2 = mib + hbs * mi_params->mi_stride;
  MB_MODE_INFO **b3 = mib + hbs * mi_params->mi_stride + hbs;

  // Check if the following conditions are met. This can be updated
  // later with more support added.
  const int further_split = b0[0]->bsize < subsize || b1[0]->bsize < subsize ||
                            b2[0]->bsize < subsize || b3[0]->bsize < subsize;
  if (further_split) return;

  const int no_skip = !b0[0]->skip_txfm || !b1[0]->skip_txfm ||
                      !b2[0]->skip_txfm || !b3[0]->skip_txfm;
  if (no_skip) return;

  const int compound = (b0[0]->ref_frame[1] != b1[0]->ref_frame[1] ||
                        b0[0]->ref_frame[1] != b2[0]->ref_frame[1] ||
                        b0[0]->ref_frame[1] != b3[0]->ref_frame[1] ||
                        b0[0]->ref_frame[1] > NONE_FRAME);
  if (compound) return;

  // Intra modes aren't considered here.
  const int different_ref = (b0[0]->ref_frame[0] != b1[0]->ref_frame[0] ||
                             b0[0]->ref_frame[0] != b2[0]->ref_frame[0] ||
                             b0[0]->ref_frame[0] != b3[0]->ref_frame[0] ||
                             b0[0]->ref_frame[0] <= INTRA_FRAME);
  if (different_ref) return;

  const int different_mode =
      (b0[0]->mode != b1[0]->mode || b0[0]->mode != b2[0]->mode ||
       b0[0]->mode != b3[0]->mode);
  if (different_mode) return;

  const int unsupported_mode =
      (b0[0]->mode != NEARESTMV && b0[0]->mode != GLOBALMV);
  if (unsupported_mode) return;

  const int different_mv = (b0[0]->mv[0].as_int != b1[0]->mv[0].as_int ||
                            b0[0]->mv[0].as_int != b2[0]->mv[0].as_int ||
                            b0[0]->mv[0].as_int != b3[0]->mv[0].as_int);
  if (different_mv) return;

  const int unsupported_motion_mode =
      (b0[0]->motion_mode != b1[0]->motion_mode ||
       b0[0]->motion_mode != b2[0]->motion_mode ||
       b0[0]->motion_mode != b3[0]->motion_mode ||
       b0[0]->motion_mode != SIMPLE_TRANSLATION);
  if (unsupported_motion_mode) return;

  const int diffent_filter =
      (b0[0]->interp_filters.as_int != b1[0]->interp_filters.as_int ||
       b0[0]->interp_filters.as_int != b2[0]->interp_filters.as_int ||
       b0[0]->interp_filters.as_int != b3[0]->interp_filters.as_int);
  if (diffent_filter) return;

  const int different_seg = (b0[0]->segment_id != b1[0]->segment_id ||
                             b0[0]->segment_id != b2[0]->segment_id ||
                             b0[0]->segment_id != b3[0]->segment_id);
  if (different_seg) return;

  // Evaluate the ref_mv.
  MB_MODE_INFO **this_mi = mib;
  BLOCK_SIZE orig_bsize = this_mi[0]->bsize;
  const PARTITION_TYPE orig_partition = this_mi[0]->partition;

  this_mi[0]->bsize = bsize;
  this_mi[0]->partition = PARTITION_NONE;
  this_mi[0]->skip_txfm = 1;

  // TODO(yunqing): functions called below can be optimized by
  // removing unrelated operations.
  av1_set_offsets_without_segment_id(cpi, &tile_data->tile_info, x, mi_row,
                                     mi_col, bsize);

  const MV_REFERENCE_FRAME ref_frame = this_mi[0]->ref_frame[0];
  int_mv frame_mv[MB_MODE_COUNT][REF_FRAMES];
  struct buf_2d yv12_mb[REF_FRAMES][MAX_MB_PLANE];
  int force_skip_low_temp_var = 0;
  int skip_pred_mv = 0;
  bool use_scaled_ref;

  for (int i = 0; i < MB_MODE_COUNT; ++i) {
    for (int j = 0; j < REF_FRAMES; ++j) {
      frame_mv[i][j].as_int = INVALID_MV;
    }
  }
  av1_copy(x->color_sensitivity, x->color_sensitivity_sb);
  skip_pred_mv = (x->nonrd_prune_ref_frame_search > 2 &&
                  x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] != 2 &&
                  x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] != 2);

  find_predictors(cpi, x, ref_frame, frame_mv, yv12_mb, bsize,
                  force_skip_low_temp_var, skip_pred_mv, &use_scaled_ref);

  int continue_merging = 1;
  if (frame_mv[NEARESTMV][ref_frame].as_mv.row != b0[0]->mv[0].as_mv.row ||
      frame_mv[NEARESTMV][ref_frame].as_mv.col != b0[0]->mv[0].as_mv.col)
    continue_merging = 0;

  if (!continue_merging) {
    this_mi[0]->bsize = orig_bsize;
    this_mi[0]->partition = orig_partition;

    // TODO(yunqing): Store the results and restore here instead of
    // calling find_predictors() again.
    av1_set_offsets_without_segment_id(cpi, &tile_data->tile_info, x, mi_row,
                                       mi_col, this_mi[0]->bsize);
    find_predictors(cpi, x, ref_frame, frame_mv, yv12_mb, this_mi[0]->bsize,
                    force_skip_low_temp_var, skip_pred_mv, &use_scaled_ref);
  } else {
    struct scale_factors *sf = get_ref_scale_factors(cm, ref_frame);
    const int is_scaled = av1_is_scaled(sf);
    const int is_y_subpel_mv = (abs(this_mi[0]->mv[0].as_mv.row) % 8) ||
                               (abs(this_mi[0]->mv[0].as_mv.col) % 8);
    const int is_uv_subpel_mv = (abs(this_mi[0]->mv[0].as_mv.row) % 16) ||
                                (abs(this_mi[0]->mv[0].as_mv.col) % 16);

    if (cpi->ppi->use_svc || is_scaled || is_y_subpel_mv || is_uv_subpel_mv) {
      const int num_planes = av1_num_planes(cm);
      set_ref_ptrs(cm, xd, ref_frame, this_mi[0]->ref_frame[1]);
      const YV12_BUFFER_CONFIG *cfg = get_ref_frame_yv12_buf(cm, ref_frame);
      av1_setup_pre_planes(xd, 0, cfg, mi_row, mi_col,
                           xd->block_ref_scale_factors[0], num_planes);

      if (!cpi->ppi->use_svc && !is_scaled && !is_y_subpel_mv) {
        assert(is_uv_subpel_mv == 1);
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize, 1,
                                      num_planes - 1);
      } else {
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize, 0,
                                      num_planes - 1);
      }
    }

    // Copy out mbmi_ext information.
    MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
    MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame = x->mbmi_ext_frame;
    av1_copy_mbmi_ext_to_mbmi_ext_frame(
        mbmi_ext_frame, mbmi_ext, av1_ref_frame_type(this_mi[0]->ref_frame));

    const BLOCK_SIZE this_subsize =
        get_partition_subsize(bsize, this_mi[0]->partition);
    // Update partition contexts.
    update_ext_partition_context(xd, mi_row, mi_col, this_subsize, bsize,
                                 this_mi[0]->partition);

    const int num_planes = av1_num_planes(cm);
    av1_reset_entropy_context(xd, bsize, num_planes);

    // Note: use x->txfm_search_params.tx_mode_search_type instead of
    // cm->features.tx_mode here.
    TX_SIZE tx_size =
        tx_size_from_tx_mode(bsize, x->txfm_search_params.tx_mode_search_type);
    if (xd->lossless[this_mi[0]->segment_id]) tx_size = TX_4X4;
    this_mi[0]->tx_size = tx_size;
    memset(this_mi[0]->inter_tx_size, this_mi[0]->tx_size,
           sizeof(this_mi[0]->inter_tx_size));

    // Update txfm contexts.
    xd->above_txfm_context =
        cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
    xd->left_txfm_context =
        xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
    set_txfm_ctxs(this_mi[0]->tx_size, xd->width, xd->height,
                  this_mi[0]->skip_txfm && is_inter_block(this_mi[0]), xd);

    // Update mi for this partition block.
    for (int y = 0; y < bs; y++) {
      for (int x_idx = 0; x_idx < bs; x_idx++) {
        this_mi[x_idx + y * mi_params->mi_stride] = this_mi[0];
      }
    }
  }
}